

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

bool __thiscall Person::operator==(Person *this,Person *other)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (this->name)._M_string_length;
  if (__n == (other->name)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->name)._M_dataplus._M_p,(other->name)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(this->age == other->age & bVar2);
}

Assistant:

bool operator==(const Person & other) const
    {
        return (name == other.name) && (age == other.age);
    }